

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MapFieldGenerator::GenerateMembers
          (MapFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  Descriptor *pDVar1;
  FieldDescriptor *descriptor;
  FieldDescriptor *descriptor_00;
  mapped_type *pmVar2;
  Options *pOVar3;
  FieldGeneratorBase *pFVar4;
  allocator local_71;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> key_generator;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> value_generator;
  
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  std::__cxx11::string::string((string *)&key_generator,"key",(allocator *)&value_generator);
  descriptor = Descriptor::FindFieldByName(pDVar1,(string *)&key_generator);
  std::__cxx11::string::~string((string *)&key_generator);
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  std::__cxx11::string::string((string *)&key_generator,"value",(allocator *)&value_generator);
  descriptor_00 = Descriptor::FindFieldByName(pDVar1,(string *)&key_generator);
  std::__cxx11::string::~string((string *)&key_generator);
  FieldGeneratorBase::type_name_abi_cxx11_
            ((string *)&key_generator,&this->super_FieldGeneratorBase,descriptor);
  std::__cxx11::string::string((string *)&value_generator,"key_type_name",&local_71);
  this_00 = &(this->super_FieldGeneratorBase).variables_;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&value_generator);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&key_generator);
  std::__cxx11::string::~string((string *)&value_generator);
  std::__cxx11::string::~string((string *)&key_generator);
  FieldGeneratorBase::type_name_abi_cxx11_
            ((string *)&key_generator,&this->super_FieldGeneratorBase,descriptor_00);
  std::__cxx11::string::string((string *)&value_generator,"value_type_name",&local_71);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&value_generator);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&key_generator);
  std::__cxx11::string::~string((string *)&value_generator);
  std::__cxx11::string::~string((string *)&key_generator);
  pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  key_generator.ptr_ = CreateFieldGenerator(descriptor,1,pOVar3);
  pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  value_generator.ptr_ = CreateFieldGenerator(descriptor_00,2,pOVar3);
  io::Printer::Print(printer,this_00,
                     "private static readonly pbc::MapField<$key_type_name$, $value_type_name$>.Codec _map_$name$_codec\n    = new pbc::MapField<$key_type_name$, $value_type_name$>.Codec("
                    );
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::operator->
                     (&key_generator);
  (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar4,printer);
  io::Printer::Print(printer,", ");
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::operator->
                     (&value_generator);
  (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar4,printer);
  io::Printer::Print(printer,this_00,
                     ", $tag$);\nprivate readonly pbc::MapField<$key_type_name$, $value_type_name$> $name$_ = new pbc::MapField<$key_type_name$, $value_type_name$>();\n"
                    );
  WritePropertyDocComment(printer,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  io::Printer::Print(printer,this_00,
                     "$access_level$ pbc::MapField<$key_type_name$, $value_type_name$> $property_name$ {\n  get { return $name$_; }\n}\n"
                    );
  if (value_generator.ptr_ != (FieldGeneratorBase *)0x0) {
    (*((value_generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
  }
  if (key_generator.ptr_ != (FieldGeneratorBase *)0x0) {
    (*((key_generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
  }
  return;
}

Assistant:

void MapFieldGenerator::GenerateMembers(io::Printer* printer) {   
  const FieldDescriptor* key_descriptor =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_descriptor =
      descriptor_->message_type()->FindFieldByName("value");
  variables_["key_type_name"] = type_name(key_descriptor);
  variables_["value_type_name"] = type_name(value_descriptor);
  scoped_ptr<FieldGeneratorBase> key_generator(
      CreateFieldGenerator(key_descriptor, 1, this->options()));
  scoped_ptr<FieldGeneratorBase> value_generator(
      CreateFieldGenerator(value_descriptor, 2, this->options()));

  printer->Print(
    variables_,
    "private static readonly pbc::MapField<$key_type_name$, $value_type_name$>.Codec _map_$name$_codec\n"
    "    = new pbc::MapField<$key_type_name$, $value_type_name$>.Codec(");
  key_generator->GenerateCodecCode(printer);
  printer->Print(", ");
  value_generator->GenerateCodecCode(printer);
  printer->Print(
    variables_,
    ", $tag$);\n"
    "private readonly pbc::MapField<$key_type_name$, $value_type_name$> $name$_ = new pbc::MapField<$key_type_name$, $value_type_name$>();\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ pbc::MapField<$key_type_name$, $value_type_name$> $property_name$ {\n"
    "  get { return $name$_; }\n"
    "}\n");
}